

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void Logger::Log(size_t level,string *msg)

{
  char *__s;
  ulong uVar1;
  tm *__tp;
  size_t sVar2;
  ostream *poVar3;
  time_t tt;
  char dateTime [28];
  long local_50;
  char local_48 [40];
  
  if (logLevel <= level) {
    local_50 = std::chrono::_V2::system_clock::now();
    local_50 = local_50 / 1000000000;
    uVar1 = 4;
    if (level < 4) {
      uVar1 = level;
    }
    __s = CATEGORY[uVar1 & 0xffffffff];
    __tp = localtime(&local_50);
    strftime(local_48,0x1c,"%FT%T%z ",__tp);
    sVar2 = strlen(local_48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_48,sVar2);
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(msg->_M_dataplus)._M_p,msg->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Logger::Log(const size_t level, const std::string& msg)
{
    if (level >= logLevel) {
        std::time_t tt = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
        const auto category = CATEGORY[std::min(level, sizeof(CATEGORY) / sizeof(CATEGORY[0]))];
        char dateTime[28];

        //TODO use std::put_time() when available
        TIME_T_TO_STRING(dateTime, &tt);
        std::cerr << dateTime << category << msg << std::endl;
    }
}